

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# funnelsort.cpp
# Opt level: O1

void funnelsort_Kway<64u,buffer_layout_bfs>(uchar **strings,size_t n)

{
  byte *pbVar1;
  byte *pbVar2;
  uchar *__s1;
  uchar *__s2;
  unsigned_long uVar3;
  int iVar4;
  uchar **tmp;
  uchar **ppuVar5;
  unsigned_long uVar6;
  uchar **ppuVar7;
  byte bVar8;
  byte bVar9;
  long lVar10;
  array<Stream,_64UL> streams;
  array<unsigned_char_*,_5068UL> buffers;
  fill<64U,_2U,_buffer_layout_bfs> local_a4b1;
  uchar **local_a4b0;
  size_t local_a4a8;
  size_t local_a4a0;
  uchar **local_a498;
  array<unsigned_long,_64UL> local_a490;
  array<Stream,_64UL> local_a290;
  uchar *local_9e90 [8];
  undefined8 local_9e50 [8];
  undefined1 auStack_9e10 [40416];
  
  tmp = (uchar **)malloc(n * 8);
  if (n < 0x20) {
    ppuVar5 = strings;
    if (1 < (long)n) {
      do {
        iVar4 = (int)n;
        n = (size_t)(iVar4 - 1);
        pbVar1 = ppuVar5[1];
        for (ppuVar7 = ppuVar5 + 1; strings < ppuVar7; ppuVar7 = ppuVar7 + -1) {
          pbVar2 = ppuVar7[-1];
          bVar8 = *pbVar2;
          bVar9 = *pbVar1;
          if (bVar8 != 0 && bVar8 == bVar9) {
            lVar10 = 1;
            do {
              bVar8 = pbVar2[lVar10];
              bVar9 = pbVar1[lVar10];
              if (bVar8 == 0) break;
              lVar10 = lVar10 + 1;
            } while (bVar8 == bVar9);
          }
          if (bVar8 <= bVar9) break;
          *ppuVar7 = pbVar2;
        }
        *ppuVar7 = pbVar1;
        ppuVar5 = ppuVar5 + 1;
      } while (2 < iVar4);
    }
  }
  else {
    local_a290._M_elems[0].n = n >> 6;
    local_a290._M_elems[0].stream = strings;
    lVar10 = 0x18;
    do {
      *(size_t *)((long)local_a290._M_elems + lVar10 + -8) =
           *(long *)((long)local_a290._M_elems + lVar10 + -0x18) + local_a290._M_elems[0].n * 8;
      *(size_t *)((long)&local_a290._M_elems[0].stream + lVar10) = local_a290._M_elems[0].n;
      lVar10 = lVar10 + 0x10;
    } while (lVar10 != 0x3f8);
    local_a290._M_elems[0x3f].stream = local_a290._M_elems[0x3e].stream + local_a290._M_elems[0].n;
    local_a290._M_elems[0x3f].n = local_a290._M_elems[0].n * -0x3f + n;
    lVar10 = 8;
    local_a4b0 = strings;
    local_a4a8 = n * 8;
    local_a4a0 = n;
    do {
      funnelsort<16u,buffer_layout_bfs>
                (*(uchar ***)((long)local_a290._M_elems + lVar10 + -8),
                 *(size_t *)((long)&local_a290._M_elems[0].stream + lVar10),tmp);
      check_input(*(uchar ***)((long)local_a290._M_elems + lVar10 + -8),
                  *(size_t *)((long)&local_a290._M_elems[0].stream + lVar10));
      lVar10 = lVar10 + 0x10;
    } while (lVar10 != 0x408);
    memset(&local_a490,0,0x200);
    local_a498 = tmp;
    while ((local_a490._M_elems[2] != 0 ||
           (fill<64U,_2U,_buffer_layout_bfs>::operator()
                      (&local_a4b1,&local_a290,local_9e90,&local_a490), local_a490._M_elems[2] != 0)
           )) {
      if ((local_a490._M_elems[3] == 0) &&
         (fill<64U,_3U,_buffer_layout_bfs>::operator()
                    ((fill<64U,_3U,_buffer_layout_bfs> *)&local_a4b1,&local_a290,local_9e90,
                     &local_a490), local_a490._M_elems[3] == 0)) {
        if (local_a490._M_elems[2] == 0) {
          __assert_fail("buffer_count[2] != 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/funnelsort.cpp"
                        ,0x247,
                        "void fill_root(std::array<Stream, K> &__restrict, unsigned char **__restrict, unsigned char **__restrict, std::array<size_t, K> &__restrict) [K = 64U, BufferLayout = buffer_layout_bfs]"
                       );
        }
        while (uVar3 = local_a490._M_elems[2], local_a490._M_elems[2] != 0) {
          memmove(tmp,local_9e50 + -local_a490._M_elems[2],local_a490._M_elems[2] * 8);
          tmp = tmp + uVar3;
          local_a490._M_elems[2] = 0;
          fill<64U,_2U,_buffer_layout_bfs>::operator()
                    (&local_a4b1,&local_a290,local_9e90,&local_a490);
        }
        goto LAB_00126799;
      }
      uVar6 = local_a490._M_elems[3];
      uVar3 = local_a490._M_elems[2];
      __s1 = local_9e90[8 - local_a490._M_elems[2]];
      if (__s1 == (uchar *)0x0) {
        __assert_fail("a != 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/funnelsort.cpp"
                      ,0x5c,"int cmp(const unsigned char *, const unsigned char *)");
      }
      __s2 = (uchar *)local_9e50[8 - local_a490._M_elems[3]];
      if (__s2 == (uchar *)0x0) {
        __assert_fail("b != 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/funnelsort.cpp"
                      ,0x5d,"int cmp(const unsigned char *, const unsigned char *)");
      }
      iVar4 = strcmp((char *)__s1,(char *)__s2);
      if (iVar4 < 1) {
        uVar6 = uVar3;
        __s2 = __s1;
      }
      *tmp = __s2;
      local_a490._M_elems[(ulong)(0 < iVar4) + 2] = uVar6 - 1;
      tmp = tmp + 1;
    }
    if (local_a490._M_elems[3] == 0) {
      __assert_fail("buffer_count[3] != 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/funnelsort.cpp"
                    ,0x239,
                    "void fill_root(std::array<Stream, K> &__restrict, unsigned char **__restrict, unsigned char **__restrict, std::array<size_t, K> &__restrict) [K = 64U, BufferLayout = buffer_layout_bfs]"
                   );
    }
    do {
      uVar3 = local_a490._M_elems[3];
      if (local_a490._M_elems[3] != 0) {
        if (local_a490._M_elems[3] * 8 != 0) {
          memmove(tmp,auStack_9e10 + local_a490._M_elems[3] * -8,local_a490._M_elems[3] * 8);
        }
        tmp = tmp + uVar3;
        local_a490._M_elems[3] = 0;
        fill<64U,_3U,_buffer_layout_bfs>::operator()
                  ((fill<64U,_3U,_buffer_layout_bfs> *)&local_a4b1,&local_a290,local_9e90,
                   &local_a490);
      }
    } while (uVar3 != 0);
LAB_00126799:
    tmp = local_a498;
    ppuVar5 = local_a4b0;
    memcpy(local_a4b0,local_a498,local_a4a8);
    check_input(ppuVar5,local_a4a0);
  }
  free(tmp);
  return;
}

Assistant:

void funnelsort_Kway(unsigned char** strings, size_t n)
{
	unsigned char** tmp = static_cast<unsigned char**>(
			malloc(n*sizeof(unsigned char*)));
	funnelsort<K, BufferLayout>(strings, n, tmp);
	free(tmp);
}